

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Configurations::setToDefault(Configurations *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"true",&local_29);
  setGlobally(this,Enabled,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"logs/myeasylog.log",&local_29);
  setGlobally(this,Filename,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"true",&local_29);
  setGlobally(this,ToFile,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"true",&local_29);
  setGlobally(this,ToStandardOutput,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"3",&local_29);
  setGlobally(this,MillisecondsWidth,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"true",&local_29);
  setGlobally(this,PerformanceTracking,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"0",&local_29);
  setGlobally(this,MaxLogFileSize,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"0",&local_29);
  setGlobally(this,LogFlushThreshold,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  setGlobally(this,Format,&local_28,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg",
             &local_29);
  set(this,Debug,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  set(this,Error,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  set(this,Fatal,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"%datetime %level-%vlevel [%logger] %msg",&local_29);
  set(this,Verbose,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"%datetime %level [%logger] [%func] [%loc] %msg",&local_29);
  set(this,Trace,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Configurations::setToDefault(void) {
  setGlobally(ConfigurationType::Enabled, std::string("true"), true);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
  setGlobally(ConfigurationType::Filename, std::string(base::consts::kDefaultLogFile), true);
#else
  ELPP_UNUSED(base::consts::kDefaultLogFile);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
#if defined(ELPP_NO_LOG_TO_FILE)
  setGlobally(ConfigurationType::ToFile, std::string("false"), true);
#else
  setGlobally(ConfigurationType::ToFile, std::string("true"), true);
#endif // defined(ELPP_NO_LOG_TO_FILE)
  setGlobally(ConfigurationType::ToStandardOutput, std::string("true"), true);
  setGlobally(ConfigurationType::SubsecondPrecision, std::string("3"), true);
  setGlobally(ConfigurationType::PerformanceTracking, std::string("true"), true);
  setGlobally(ConfigurationType::MaxLogFileSize, std::string("0"), true);
  setGlobally(ConfigurationType::LogFlushThreshold, std::string("0"), true);

  setGlobally(ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"), true);
  set(Level::Debug, ConfigurationType::Format,
      std::string("%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg"));
  // INFO and WARNING are set to default by Level::Global
  set(Level::Error, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  set(Level::Fatal, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  set(Level::Verbose, ConfigurationType::Format, std::string("%datetime %level-%vlevel [%logger] %msg"));
  set(Level::Trace, ConfigurationType::Format, std::string("%datetime %level [%logger] [%func] [%loc] %msg"));
}